

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

bool __thiscall QMYSQLResult::fetchNext(QMYSQLResult *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  QSqlError local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar3 = QSqlResult::driver();
  if (lVar3 != 0) {
    if (*(char *)(lVar1 + 0xfd) == '\x01') {
      iVar2 = mysql_stmt_fetch(*(undefined8 *)(lVar1 + 0xd8));
      if (iVar2 == 0) {
LAB_00109956:
        iVar2 = QSqlResult::at();
        (**(code **)(*(long *)this + 0x18))(this,iVar2 + 1);
        bVar4 = true;
        goto LAB_00109972;
      }
      if ((iVar2 == 0x65) || (iVar2 == 1)) {
        bVar4 = false;
        QCoreApplication::translate((char *)&QStack_48,"QMYSQLResult","Unable to fetch data",0);
        qMakeStmtError((QString *)local_30,(ErrorType)&QStack_48,*(MYSQL_STMT **)(lVar1 + 0xd8));
        (**(code **)(*(long *)this + 0x28))(this,local_30);
        QSqlError::~QSqlError(local_30);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
        goto LAB_00109972;
      }
    }
    else {
      lVar3 = mysql_fetch_row(*(undefined8 *)(lVar1 + 0xb0));
      *(long *)(lVar1 + 0xb8) = lVar3;
      if (lVar3 != 0) goto LAB_00109956;
    }
  }
  bVar4 = false;
LAB_00109972:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QMYSQLResult::fetchNext()
{
    Q_D(QMYSQLResult);
    if (!driver())
        return false;
    if (d->preparedQuery) {
        int nRC = mysql_stmt_fetch(d->stmt);
        if (nRC) {
            if (nRC == 1 || nRC == MYSQL_DATA_TRUNCATED)
                setLastError(qMakeStmtError(QCoreApplication::translate("QMYSQLResult",
                                    "Unable to fetch data"), QSqlError::StatementError, d->stmt));
            return false;
        }
    } else {
        d->row = mysql_fetch_row(d->result);
        if (!d->row)
            return false;
    }
    setAt(at() + 1);
    return true;
}